

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

QPolygon * __thiscall QGraphicsView::mapFromScene(QGraphicsView *this,QRectF *rect)

{
  QGraphicsViewPrivate *pQVar1;
  QTransform *this_00;
  qint64 qVar2;
  QPoint QVar3;
  reference pQVar4;
  QPolygon *in_RDI;
  long in_FS_OFFSET;
  qreal qVar5;
  QTransform *x;
  QGraphicsViewPrivate *d;
  QPolygon *poly;
  QPointF scrollOffset;
  QPointF bl;
  QPointF br;
  QPointF tr;
  QPointF tl;
  qsizetype in_stack_fffffffffffffe58;
  QGraphicsViewPrivate *in_stack_fffffffffffffe60;
  QRectF *in_stack_fffffffffffffe68;
  QRectF *this_01;
  QPointF *in_stack_fffffffffffffe70;
  QPointF local_118;
  QPointF local_108;
  QPointF local_f8;
  QPointF local_e8;
  QPointF local_d8;
  QPointF local_c8;
  qreal local_b8;
  qreal local_b0;
  QPointF local_a8;
  qreal local_98;
  qreal local_90;
  QPointF local_88;
  qreal local_78;
  qreal local_70;
  QPointF local_68;
  qreal local_58;
  qreal local_50;
  QPointF local_48;
  QPointF local_38;
  QPointF local_28;
  QPointF local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QGraphicsView *)0xa38a22);
  local_18.xp = -NAN;
  local_18.yp = -NAN;
  QPointF::QPointF(&local_18);
  local_28.xp = -NAN;
  local_28.yp = -NAN;
  QPointF::QPointF(&local_28);
  local_38.xp = -NAN;
  local_38.yp = -NAN;
  QPointF::QPointF(&local_38);
  local_48.xp = -NAN;
  local_48.yp = -NAN;
  QPointF::QPointF(&local_48);
  if ((*(uint *)&pQVar1->field_0x300 >> 4 & 1) == 0) {
    this_00 = &pQVar1->matrix;
    this_01 = (QRectF *)this_00;
    local_68 = QRectF::topLeft((QRectF *)this_00);
    qVar5 = local_68.yp;
    local_58 = (qreal)QTransform::map((QPointF *)this_01);
    in_stack_fffffffffffffe70 = (QPointF *)this_00;
    local_50 = qVar5;
    local_18.xp = local_58;
    local_18.yp = qVar5;
    local_88 = QRectF::topRight(this_01);
    qVar5 = local_88.yp;
    local_78 = (qreal)QTransform::map((QPointF *)in_stack_fffffffffffffe70);
    local_70 = qVar5;
    local_28.xp = local_78;
    local_28.yp = qVar5;
    local_a8 = QRectF::bottomRight(this_01);
    qVar5 = local_a8.yp;
    local_98 = (qreal)QTransform::map((QPointF *)this_00);
    local_90 = qVar5;
    local_38.xp = local_98;
    local_38.yp = qVar5;
    local_c8 = QRectF::bottomLeft(this_01);
    qVar5 = local_c8.yp;
    local_b8 = (qreal)QTransform::map((QPointF *)this_00);
    local_b0 = qVar5;
    local_48.xp = local_b8;
    local_48.yp = qVar5;
  }
  else {
    local_d8 = QRectF::topLeft(in_stack_fffffffffffffe68);
    local_18.xp = local_d8.xp;
    local_18.yp = local_d8.yp;
    local_e8 = QRectF::topRight(in_stack_fffffffffffffe68);
    local_28.xp = local_e8.xp;
    local_28.yp = local_e8.yp;
    local_f8 = QRectF::bottomRight(in_stack_fffffffffffffe68);
    local_38.xp = local_f8.xp;
    local_38.yp = local_f8.yp;
    local_108 = QRectF::bottomLeft(in_stack_fffffffffffffe68);
    local_48.xp = local_108.xp;
    local_48.yp = local_108.yp;
  }
  local_118.xp = -NAN;
  local_118.yp = -NAN;
  qVar2 = QGraphicsViewPrivate::horizontalScroll(in_stack_fffffffffffffe60);
  pQVar1 = (QGraphicsViewPrivate *)(double)qVar2;
  qVar2 = QGraphicsViewPrivate::verticalScroll(pQVar1);
  QPointF::QPointF(&local_118,(qreal)pQVar1,(double)qVar2);
  QPointF::operator-=(&local_18,&local_118);
  QPointF::operator-=(&local_28,&local_118);
  QPointF::operator-=(&local_38,&local_118);
  QPointF::operator-=(&local_48,&local_118);
  (in_RDI->super_QList<QPoint>).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->super_QList<QPoint>).d.ptr = (QPoint *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->super_QList<QPoint>).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QPolygon::QList((QPolygon *)pQVar1,in_stack_fffffffffffffe58);
  QVar3 = QPointF::toPoint(in_stack_fffffffffffffe70);
  pQVar4 = QList<QPoint>::operator[]((QList<QPoint> *)pQVar1,in_stack_fffffffffffffe58);
  *pQVar4 = QVar3;
  QVar3 = QPointF::toPoint(in_stack_fffffffffffffe70);
  pQVar4 = QList<QPoint>::operator[]((QList<QPoint> *)pQVar1,in_stack_fffffffffffffe58);
  *pQVar4 = QVar3;
  QVar3 = QPointF::toPoint(in_stack_fffffffffffffe70);
  pQVar4 = QList<QPoint>::operator[]((QList<QPoint> *)pQVar1,in_stack_fffffffffffffe58);
  *pQVar4 = QVar3;
  QVar3 = QPointF::toPoint(in_stack_fffffffffffffe70);
  pQVar4 = QList<QPoint>::operator[]((QList<QPoint> *)pQVar1,in_stack_fffffffffffffe58);
  *pQVar4 = QVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QPolygon QGraphicsView::mapFromScene(const QRectF &rect) const
{
    Q_D(const QGraphicsView);
    QPointF tl;
    QPointF tr;
    QPointF br;
    QPointF bl;
    if (!d->identityMatrix) {
        const QTransform &x = d->matrix;
        tl = x.map(rect.topLeft());
        tr = x.map(rect.topRight());
        br = x.map(rect.bottomRight());
        bl = x.map(rect.bottomLeft());
    } else {
        tl = rect.topLeft();
        tr = rect.topRight();
        br = rect.bottomRight();
        bl = rect.bottomLeft();
    }
    QPointF scrollOffset(d->horizontalScroll(), d->verticalScroll());
    tl -= scrollOffset;
    tr -= scrollOffset;
    br -= scrollOffset;
    bl -= scrollOffset;

    QPolygon poly(4);
    poly[0] = tl.toPoint();
    poly[1] = tr.toPoint();
    poly[2] = br.toPoint();
    poly[3] = bl.toPoint();
    return poly;
}